

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_CCtxParams_setZstdParams(ZSTD_CCtx_params *cctxParams,ZSTD_parameters *params)

{
  uint uVar1;
  int iVar2;
  ZSTD_parameters *params_local;
  ZSTD_CCtx_params *cctxParams_local;
  
  uVar1 = (params->cParams).chainLog;
  (cctxParams->cParams).windowLog = (params->cParams).windowLog;
  (cctxParams->cParams).chainLog = uVar1;
  uVar1 = (params->cParams).searchLog;
  (cctxParams->cParams).hashLog = (params->cParams).hashLog;
  (cctxParams->cParams).searchLog = uVar1;
  uVar1 = (params->cParams).targetLength;
  (cctxParams->cParams).minMatch = (params->cParams).minMatch;
  (cctxParams->cParams).targetLength = uVar1;
  (cctxParams->cParams).strategy = (params->cParams).strategy;
  iVar2 = (params->fParams).checksumFlag;
  (cctxParams->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
  (cctxParams->fParams).checksumFlag = iVar2;
  (cctxParams->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
  cctxParams->compressionLevel = 0;
  return;
}

Assistant:

static void ZSTD_CCtxParams_setZstdParams(
        ZSTD_CCtx_params* cctxParams, const ZSTD_parameters* params)
{
    assert(!ZSTD_checkCParams(params->cParams));
    cctxParams->cParams = params->cParams;
    cctxParams->fParams = params->fParams;
    /* Should not matter, as all cParams are presumed properly defined.
     * But, set it for tracing anyway.
     */
    cctxParams->compressionLevel = ZSTD_NO_CLEVEL;
}